

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O0

int jas_tvparser_next(jas_tvparser_t *tvp)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  char *val;
  char *tag;
  char *p;
  jas_tvparser_t *tvp_local;
  
  tag = tvp->pos;
  while( true ) {
    pcVar1 = tag;
    bVar4 = false;
    if (*tag != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)*tag] & 0x2000) != 0;
    }
    if (!bVar4) break;
    tag = tag + 1;
  }
  if (*tag == '\0') {
    tvp->pos = tag;
    tvp_local._4_4_ = 1;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((((*ppuVar2)[(int)*tag] & 0x400) == 0) && (*tag != '_')) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*tag] & 0x800) == 0)) {
      tvp_local._4_4_ = -1;
    }
    else {
      while( true ) {
        bVar4 = false;
        if (*tag != '\0') {
          ppuVar2 = __ctype_b_loc();
          bVar4 = true;
          if ((((*ppuVar2)[(int)*tag] & 0x400) == 0) && (bVar4 = true, *tag != '_')) {
            ppuVar2 = __ctype_b_loc();
            bVar4 = ((*ppuVar2)[(int)*tag] & 0x800) != 0;
          }
        }
        if (!bVar4) break;
        tag = tag + 1;
      }
      if (*tag == '\0') {
        tvp->tag = pcVar1;
        tvp->val = "";
        tvp->pos = tag;
        tvp_local._4_4_ = 0;
      }
      else if (*tag == '=') {
        pcVar3 = tag + 1;
        *tag = '\0';
        tag = pcVar3;
        while( true ) {
          bVar4 = false;
          if (*tag != '\0') {
            ppuVar2 = __ctype_b_loc();
            bVar4 = ((*ppuVar2)[(int)*tag] & 0x2000) == 0;
          }
          if (!bVar4) break;
          tag = tag + 1;
        }
        if (*tag != '\0') {
          *tag = '\0';
          tag = tag + 1;
        }
        tvp->pos = tag;
        tvp->tag = pcVar1;
        tvp->val = pcVar3;
        tvp_local._4_4_ = 0;
      }
      else if ((*tag == '\0') || (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*tag] & 0x2000) != 0))
      {
        *tag = '\0';
        tvp->tag = pcVar1;
        tvp->val = "";
        tvp->pos = tag + 1;
        tvp_local._4_4_ = 0;
      }
      else {
        tvp_local._4_4_ = -1;
      }
    }
  }
  return tvp_local._4_4_;
}

Assistant:

int jas_tvparser_next(jas_tvparser_t *tvp)
{
	char *p;
	char *tag;
	char *val;

	/* Skip any leading whitespace. */
	p = tvp->pos;
	while (*p != '\0' && isspace(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* No more tags are present. */
		tvp->pos = p;
		return 1;
	}

	/* Does the tag name begin with a valid character? */
	if (!JAS_TVP_ISTAG(*p)) {
		return -1;
	}

	/* Remember where the tag name begins. */
	tag = p;

	/* Find the end of the tag name. */
	while (*p != '\0' && JAS_TVP_ISTAG(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* The value field is empty. */
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	/* Is a value field not present? */
	if (*p != '=') {
		if (*p != '\0' && !isspace(*p)) {
			return -1;
		}
		*p++ = '\0';
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	*p++ = '\0';

	val = p;
	while (*p != '\0' && !isspace(*p)) {
		++p;
	}

	if (*p != '\0') {
		*p++ = '\0';
	}

	tvp->pos = p;
	tvp->tag = tag;
	tvp->val = val;

	return 0;
}